

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O3

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderNonMessageField
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,Field *field,
          StringPiece field_name,ObjectWriter *ow)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  TypeInfo *pTVar4;
  string *psVar5;
  size_t sVar6;
  converter *this_00;
  char *size;
  int iVar7;
  uint *puVar8;
  ulong *puVar9;
  long lVar10;
  int64 iVar11;
  undefined4 extraout_var;
  EnumValue *pEVar12;
  char *pcVar13;
  ulong uVar14;
  pointer pcVar15;
  uint32 uVar16;
  CodedInputStream *pCVar17;
  _Alloc_hider _Var18;
  undefined1 auVar19 [8];
  pair<unsigned_long,_bool> pVar20;
  StringPiece input;
  string local_98;
  pointer local_78;
  undefined1 local_70 [8];
  string strbuffer;
  ulong local_40;
  uint64 buffer64;
  uint32 buffer32;
  
  strbuffer.field_2._8_8_ = field_name.length_;
  pcVar13 = field_name.ptr_;
  local_70 = (undefined1  [8])&strbuffer._M_string_length;
  strbuffer._M_dataplus._M_p = (pointer)0x0;
  strbuffer._M_string_length._0_1_ = 0;
  switch(field->kind_) {
  case 1:
    pCVar17 = this->stream_;
    puVar9 = (ulong *)pCVar17->buffer_;
    if (*(int *)&pCVar17->buffer_end_ - (int)puVar9 < 8) {
      io::CodedInputStream::ReadLittleEndian64Fallback(pCVar17,&local_40);
    }
    else {
      local_40 = *puVar9;
      pCVar17->buffer_ = (uint8 *)(puVar9 + 1);
    }
    (*ow->_vptr_ObjectWriter[0xb])(local_40,ow,pcVar13,strbuffer.field_2._8_8_);
    break;
  case 2:
    pCVar17 = this->stream_;
    puVar8 = (uint *)pCVar17->buffer_;
    if (*(int *)&pCVar17->buffer_end_ - (int)puVar8 < 4) {
      io::CodedInputStream::ReadLittleEndian32Fallback(pCVar17,(uint32 *)((long)&buffer64 + 4));
    }
    else {
      buffer64._4_4_ = *puVar8;
      pCVar17->buffer_ = (uint8 *)(puVar8 + 1);
    }
    (*ow->_vptr_ObjectWriter[0xc])((ulong)buffer64._4_4_,ow,pcVar13,strbuffer.field_2._8_8_);
    break;
  case 3:
    pCVar17 = this->stream_;
    puVar3 = pCVar17->buffer_;
    if ((pCVar17->buffer_end_ <= puVar3) || (local_40 = (ulong)(char)*puVar3, (long)local_40 < 0)) {
      pVar20 = io::CodedInputStream::ReadVarint64Fallback(pCVar17);
      uVar14 = pVar20.first;
      local_40 = uVar14;
      goto LAB_00318c87;
    }
    puVar9 = (ulong *)(puVar3 + 1);
LAB_00318a37:
    pCVar17->buffer_ = (uint8 *)puVar9;
    goto LAB_00318a3a;
  case 4:
    pCVar17 = this->stream_;
    puVar3 = pCVar17->buffer_;
    if ((puVar3 < pCVar17->buffer_end_) && (local_40 = (ulong)(char)*puVar3, -1 < (long)local_40)) {
      puVar9 = (ulong *)(puVar3 + 1);
LAB_00318ba7:
      pCVar17->buffer_ = (uint8 *)puVar9;
      goto LAB_00318baa;
    }
    pVar20 = io::CodedInputStream::ReadVarint64Fallback(pCVar17);
    local_40 = pVar20.first;
    lVar10 = 0x50;
    uVar14 = local_40;
    goto LAB_00318c9f;
  case 5:
    pCVar17 = this->stream_;
    pbVar2 = pCVar17->buffer_;
    if (pbVar2 < pCVar17->buffer_end_) {
      bVar1 = *pbVar2;
      uVar14 = (ulong)bVar1;
      uVar16 = (uint32)bVar1;
      if (-1 < (char)bVar1) {
        buffer64._4_4_ = (uint)bVar1;
        puVar8 = (uint *)(pbVar2 + 1);
        goto LAB_00318bda;
      }
    }
    else {
      uVar16 = 0;
    }
    uVar14 = io::CodedInputStream::ReadVarint32Fallback(pCVar17,uVar16);
    buffer64._4_4_ = (uint)uVar14;
    goto LAB_00318f08;
  case 6:
    pCVar17 = this->stream_;
    puVar9 = (ulong *)pCVar17->buffer_;
    if (7 < *(int *)&pCVar17->buffer_end_ - (int)puVar9) {
      local_40 = *puVar9;
      puVar9 = puVar9 + 1;
      goto LAB_00318ba7;
    }
    io::CodedInputStream::ReadLittleEndian64Fallback(pCVar17,&local_40);
LAB_00318baa:
    lVar10 = 0x50;
    uVar14 = local_40;
    goto LAB_00318c9f;
  case 7:
    pCVar17 = this->stream_;
    puVar8 = (uint *)pCVar17->buffer_;
    if (3 < *(int *)&pCVar17->buffer_end_ - (int)puVar8) {
      buffer64._4_4_ = *puVar8;
      uVar14 = (ulong)buffer64._4_4_;
      puVar8 = puVar8 + 1;
LAB_00318af1:
      pCVar17->buffer_ = (uint8 *)puVar8;
      goto LAB_00318af4;
    }
    io::CodedInputStream::ReadLittleEndian32Fallback(pCVar17,(uint32 *)((long)&buffer64 + 4));
    lVar10 = 0x40;
LAB_00318ed8:
    uVar14 = (ulong)buffer64._4_4_;
    goto LAB_00318f0d;
  case 8:
    pCVar17 = this->stream_;
    puVar3 = pCVar17->buffer_;
    if ((puVar3 < pCVar17->buffer_end_) && (local_40 = (ulong)(char)*puVar3, -1 < (long)local_40)) {
      pCVar17->buffer_ = puVar3 + 1;
    }
    else {
      pVar20 = io::CodedInputStream::ReadVarint64Fallback(pCVar17);
      local_40 = pVar20.first;
    }
    (*ow->_vptr_ObjectWriter[6])(ow,pcVar13,strbuffer.field_2._8_8_,(ulong)(local_40 != 0));
    break;
  case 9:
    pCVar17 = this->stream_;
    pbVar2 = pCVar17->buffer_;
    if (pbVar2 < pCVar17->buffer_end_) {
      bVar1 = *pbVar2;
      uVar16 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_00318f67;
      buffer64._4_4_ = (uint)bVar1;
      pCVar17->buffer_ = pbVar2 + 1;
    }
    else {
      uVar16 = 0;
LAB_00318f67:
      iVar11 = io::CodedInputStream::ReadVarint32Fallback(pCVar17,uVar16);
      buffer64._4_4_ = (uint)iVar11;
      pCVar17 = this->stream_;
    }
    io::CodedInputStream::ReadString(pCVar17,(string *)local_70,buffer64._4_4_);
    _Var18 = strbuffer._M_dataplus;
    auVar19 = local_70;
    lVar10 = 0x68;
    if ((long)strbuffer._M_dataplus._M_p < 0) {
      StringPiece::LogFatalSizeTooBig((size_t)strbuffer._M_dataplus._M_p,"size_t to int conversion")
      ;
    }
    goto LAB_00318fa3;
  case 0xc:
    pCVar17 = this->stream_;
    pbVar2 = pCVar17->buffer_;
    if (pbVar2 < pCVar17->buffer_end_) {
      bVar1 = *pbVar2;
      uVar16 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_00318f27;
      buffer64._4_4_ = (uint)bVar1;
      pCVar17->buffer_ = pbVar2 + 1;
    }
    else {
      uVar16 = 0;
LAB_00318f27:
      iVar11 = io::CodedInputStream::ReadVarint32Fallback(pCVar17,uVar16);
      buffer64._4_4_ = (uint)iVar11;
      pCVar17 = this->stream_;
    }
    io::CodedInputStream::ReadString(pCVar17,(string *)local_70,buffer64._4_4_);
    _Var18 = strbuffer._M_dataplus;
    auVar19 = local_70;
    lVar10 = 0x70;
    if ((long)strbuffer._M_dataplus._M_p < 0) {
      StringPiece::LogFatalSizeTooBig((size_t)strbuffer._M_dataplus._M_p,"size_t to int conversion")
      ;
    }
LAB_00318fa3:
    (**(code **)((long)ow->_vptr_ObjectWriter + lVar10))
              (ow,pcVar13,strbuffer.field_2._8_8_,auVar19,_Var18._M_p);
    break;
  case 0xd:
    pCVar17 = this->stream_;
    pbVar2 = pCVar17->buffer_;
    if (pbVar2 < pCVar17->buffer_end_) {
      bVar1 = *pbVar2;
      uVar14 = (ulong)bVar1;
      uVar16 = (uint32)bVar1;
      if (-1 < (char)bVar1) {
        buffer64._4_4_ = (uint)bVar1;
        puVar8 = (uint *)(pbVar2 + 1);
        goto LAB_00318af1;
      }
    }
    else {
      uVar16 = 0;
    }
    uVar14 = io::CodedInputStream::ReadVarint32Fallback(pCVar17,uVar16);
    buffer64._4_4_ = (uint)uVar14;
LAB_00318af4:
    lVar10 = 0x40;
    goto LAB_00318f0d;
  case 0xe:
    pCVar17 = this->stream_;
    pbVar2 = pCVar17->buffer_;
    if (pbVar2 < pCVar17->buffer_end_) {
      bVar1 = *pbVar2;
      uVar16 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_00318cfc;
      buffer64._4_4_ = (uint)bVar1;
      pCVar17->buffer_ = pbVar2 + 1;
    }
    else {
      uVar16 = 0;
LAB_00318cfc:
      iVar11 = io::CodedInputStream::ReadVarint32Fallback(pCVar17,uVar16);
      buffer64._4_4_ = (uint)iVar11;
    }
    iVar7 = std::__cxx11::string::compare((char *)(field->type_url_).ptr_);
    if (iVar7 == 0) {
      (*ow->_vptr_ObjectWriter[0xf])(ow,pcVar13,strbuffer.field_2._8_8_);
    }
    else {
      pTVar4 = this->typeinfo_;
      psVar5 = (field->type_url_).ptr_;
      pcVar15 = (psVar5->_M_dataplus)._M_p;
      sVar6 = psVar5->_M_string_length;
      local_78 = pcVar15;
      if ((long)sVar6 < 0) {
        StringPiece::LogFatalSizeTooBig(sVar6,"size_t to int conversion");
      }
      iVar7 = (*pTVar4->_vptr_TypeInfo[4])(pTVar4,local_78,sVar6);
      if ((Enum *)CONCAT44(extraout_var,iVar7) == (Enum *)0x0) {
        if (this->render_unknown_enum_values_ == true) {
          (*ow->_vptr_ObjectWriter[7])(ow,pcVar13,strbuffer.field_2._8_8_,(ulong)buffer64._4_4_);
        }
      }
      else {
        pEVar12 = anon_unknown_4::FindEnumValueByNumber
                            ((Enum *)CONCAT44(extraout_var,iVar7),buffer64._4_4_);
        if (pEVar12 == (EnumValue *)0x0) {
          if (this->render_unknown_enum_values_ != true) break;
        }
        else if (this->use_ints_for_enums_ == false) {
          if (this->use_lower_camel_for_enums_ == true) {
            psVar5 = (pEVar12->name_).ptr_;
            this_00 = (converter *)(psVar5->_M_dataplus)._M_p;
            size = (char *)psVar5->_M_string_length;
            if ((long)size < 0) {
              StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
            }
            input.length_ = (stringpiece_ssize_type)pcVar15;
            input.ptr_ = size;
            EnumValueNameToLowerCamelCase_abi_cxx11_(&local_98,this_00,input);
            _Var18._M_p = local_98._M_dataplus._M_p;
            if ((long)local_98._M_string_length < 0) {
              StringPiece::LogFatalSizeTooBig(local_98._M_string_length,"size_t to int conversion");
            }
            (*ow->_vptr_ObjectWriter[0xd])
                      (ow,pcVar13,strbuffer.field_2._8_8_,_Var18._M_p,local_98._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p);
            }
          }
          else {
            psVar5 = (pEVar12->name_).ptr_;
            pcVar15 = (psVar5->_M_dataplus)._M_p;
            sVar6 = psVar5->_M_string_length;
            if ((long)sVar6 < 0) {
              StringPiece::LogFatalSizeTooBig(sVar6,"size_t to int conversion");
            }
            (*ow->_vptr_ObjectWriter[0xd])(ow,pcVar13,strbuffer.field_2._8_8_,pcVar15,sVar6);
          }
          break;
        }
        (*ow->_vptr_ObjectWriter[7])(ow,pcVar13,strbuffer.field_2._8_8_,(ulong)buffer64._4_4_);
      }
    }
    break;
  case 0xf:
    pCVar17 = this->stream_;
    puVar8 = (uint *)pCVar17->buffer_;
    if (*(int *)&pCVar17->buffer_end_ - (int)puVar8 < 4) {
      io::CodedInputStream::ReadLittleEndian32Fallback(pCVar17,(uint32 *)((long)&buffer64 + 4));
      lVar10 = 0x38;
      goto LAB_00318ed8;
    }
    buffer64._4_4_ = *puVar8;
    uVar14 = (ulong)buffer64._4_4_;
    puVar8 = puVar8 + 1;
LAB_00318bda:
    pCVar17->buffer_ = (uint8 *)puVar8;
    goto LAB_00318f08;
  case 0x10:
    pCVar17 = this->stream_;
    puVar9 = (ulong *)pCVar17->buffer_;
    if (7 < *(int *)&pCVar17->buffer_end_ - (int)puVar9) {
      local_40 = *puVar9;
      puVar9 = puVar9 + 1;
      goto LAB_00318a37;
    }
    io::CodedInputStream::ReadLittleEndian64Fallback(pCVar17,&local_40);
LAB_00318a3a:
    lVar10 = 0x48;
    uVar14 = local_40;
    goto LAB_00318c9f;
  case 0x11:
    pCVar17 = this->stream_;
    pbVar2 = pCVar17->buffer_;
    if (pbVar2 < pCVar17->buffer_end_) {
      bVar1 = *pbVar2;
      uVar14 = (ulong)bVar1;
      uVar16 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_00318edf;
      buffer64._4_4_ = (uint)bVar1;
      pCVar17->buffer_ = pbVar2 + 1;
    }
    else {
      uVar16 = 0;
LAB_00318edf:
      uVar14 = io::CodedInputStream::ReadVarint32Fallback(pCVar17,uVar16);
      buffer64._4_4_ = (uint)uVar14;
    }
    uVar14 = (ulong)(-((uint)uVar14 & 1) ^ (uint)(uVar14 >> 1) & 0x7fffffff);
LAB_00318f08:
    lVar10 = 0x38;
LAB_00318f0d:
    (**(code **)((long)ow->_vptr_ObjectWriter + lVar10))(ow,pcVar13,strbuffer.field_2._8_8_,uVar14);
    break;
  case 0x12:
    pCVar17 = this->stream_;
    puVar3 = pCVar17->buffer_;
    if ((puVar3 < pCVar17->buffer_end_) && (local_40 = (ulong)(char)*puVar3, -1 < (long)local_40)) {
      pCVar17->buffer_ = puVar3 + 1;
    }
    else {
      pVar20 = io::CodedInputStream::ReadVarint64Fallback(pCVar17);
      local_40 = pVar20.first;
    }
    uVar14 = -(ulong)((uint)local_40 & 1) ^ local_40 >> 1;
LAB_00318c87:
    lVar10 = 0x48;
LAB_00318c9f:
    (**(code **)((long)ow->_vptr_ObjectWriter + lVar10))(ow,pcVar13,strbuffer.field_2._8_8_,uVar14);
  }
  Status::Status(__return_storage_ptr__);
  if (local_70 != (undefined1  [8])&strbuffer._M_string_length) {
    operator_delete((void *)local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectSource::RenderNonMessageField(
    const google::protobuf::Field* field, StringPiece field_name,
    ObjectWriter* ow) const {
  // Temporary buffers of different types.
  uint32 buffer32;
  uint64 buffer64;
  std::string strbuffer;
  switch (field->kind()) {
    case google::protobuf::Field::TYPE_BOOL: {
      stream_->ReadVarint64(&buffer64);
      ow->RenderBool(field_name, buffer64 != 0);
      break;
    }
    case google::protobuf::Field::TYPE_INT32: {
      stream_->ReadVarint32(&buffer32);
      ow->RenderInt32(field_name, bit_cast<int32>(buffer32));
      break;
    }
    case google::protobuf::Field::TYPE_INT64: {
      stream_->ReadVarint64(&buffer64);
      ow->RenderInt64(field_name, bit_cast<int64>(buffer64));
      break;
    }
    case google::protobuf::Field::TYPE_UINT32: {
      stream_->ReadVarint32(&buffer32);
      ow->RenderUint32(field_name, bit_cast<uint32>(buffer32));
      break;
    }
    case google::protobuf::Field::TYPE_UINT64: {
      stream_->ReadVarint64(&buffer64);
      ow->RenderUint64(field_name, bit_cast<uint64>(buffer64));
      break;
    }
    case google::protobuf::Field::TYPE_SINT32: {
      stream_->ReadVarint32(&buffer32);
      ow->RenderInt32(field_name, WireFormatLite::ZigZagDecode32(buffer32));
      break;
    }
    case google::protobuf::Field::TYPE_SINT64: {
      stream_->ReadVarint64(&buffer64);
      ow->RenderInt64(field_name, WireFormatLite::ZigZagDecode64(buffer64));
      break;
    }
    case google::protobuf::Field::TYPE_SFIXED32: {
      stream_->ReadLittleEndian32(&buffer32);
      ow->RenderInt32(field_name, bit_cast<int32>(buffer32));
      break;
    }
    case google::protobuf::Field::TYPE_SFIXED64: {
      stream_->ReadLittleEndian64(&buffer64);
      ow->RenderInt64(field_name, bit_cast<int64>(buffer64));
      break;
    }
    case google::protobuf::Field::TYPE_FIXED32: {
      stream_->ReadLittleEndian32(&buffer32);
      ow->RenderUint32(field_name, bit_cast<uint32>(buffer32));
      break;
    }
    case google::protobuf::Field::TYPE_FIXED64: {
      stream_->ReadLittleEndian64(&buffer64);
      ow->RenderUint64(field_name, bit_cast<uint64>(buffer64));
      break;
    }
    case google::protobuf::Field::TYPE_FLOAT: {
      stream_->ReadLittleEndian32(&buffer32);
      ow->RenderFloat(field_name, bit_cast<float>(buffer32));
      break;
    }
    case google::protobuf::Field::TYPE_DOUBLE: {
      stream_->ReadLittleEndian64(&buffer64);
      ow->RenderDouble(field_name, bit_cast<double>(buffer64));
      break;
    }
    case google::protobuf::Field::TYPE_ENUM: {
      stream_->ReadVarint32(&buffer32);

      // If the field represents an explicit NULL value, render null.
      if (field->type_url() == kStructNullValueTypeUrl) {
        ow->RenderNull(field_name);
        break;
      }

      // Get the nested enum type for this field.
      // TODO(skarvaje): Avoid string manipulation. Find ways to speed this
      // up.
      const google::protobuf::Enum* en =
          typeinfo_->GetEnumByTypeUrl(field->type_url());
      // Lookup the name of the enum, and render that. Unknown enum values
      // are printed as integers.
      if (en != nullptr) {
        const google::protobuf::EnumValue* enum_value =
            FindEnumValueByNumber(*en, buffer32);
        if (enum_value != nullptr) {
          if (use_ints_for_enums_) {
            ow->RenderInt32(field_name, buffer32);
          } else if (use_lower_camel_for_enums_) {
            ow->RenderString(field_name,
                             EnumValueNameToLowerCamelCase(enum_value->name()));
          } else {
            ow->RenderString(field_name, enum_value->name());
          }
        } else if (render_unknown_enum_values_) {
          ow->RenderInt32(field_name, buffer32);
        }
      } else if (render_unknown_enum_values_) {
        ow->RenderInt32(field_name, buffer32);
      }
      break;
    }
    case google::protobuf::Field::TYPE_STRING: {
      stream_->ReadVarint32(&buffer32);  // string size.
      stream_->ReadString(&strbuffer, buffer32);
      ow->RenderString(field_name, strbuffer);
      break;
    }
    case google::protobuf::Field::TYPE_BYTES: {
      stream_->ReadVarint32(&buffer32);  // bytes size.
      stream_->ReadString(&strbuffer, buffer32);
      ow->RenderBytes(field_name, strbuffer);
      break;
    }
    default:
      break;
  }
  return util::Status();
}